

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O0

size_t __thiscall
capnp::computeUnpackedSizeInWords(capnp *this,ArrayPtr<const_unsigned_char> packedBytes)

{
  bool bVar1;
  uint x;
  int iVar2;
  Fault local_150;
  Fault f_3;
  DebugExpression<long> local_140;
  undefined1 local_138 [8];
  DebugComparison<long,_unsigned_long_&> _kjCondition_3;
  size_t bytes;
  size_t words;
  Fault f_2;
  undefined1 local_f0 [8];
  DebugComparison<const_unsigned_char_*&,_const_unsigned_char_*&> _kjCondition_2;
  Fault f_1;
  undefined1 local_b8 [8];
  DebugComparison<const_unsigned_char_*&,_const_unsigned_char_*&> _kjCondition_1;
  Fault local_80;
  Fault f;
  DebugExpression<long> local_70;
  undefined1 local_68 [8];
  DebugComparison<long,_unsigned_long_&> _kjCondition;
  size_t count;
  size_t sStack_30;
  uint tag;
  size_t total;
  byte *end;
  byte *ptr;
  ArrayPtr<const_unsigned_char> packedBytes_local;
  
  packedBytes_local.ptr = packedBytes.ptr;
  ptr = (byte *)this;
  end = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&ptr);
  total = (size_t)kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&ptr);
  sStack_30 = 0;
  while( true ) {
    do {
      while( true ) {
        if (total <= end) {
          return sStack_30;
        }
        x = (uint)*end;
        iVar2 = kj::popCount(x);
        _kjCondition._32_8_ = SEXT48(iVar2);
        sStack_30 = sStack_30 + 1;
        f.exception = (Exception *)(total - (long)end);
        local_70 = kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(long *)&f);
        kj::_::DebugExpression<long>::operator>=
                  ((DebugComparison<long,_unsigned_long_&> *)local_68,&local_70,
                   (unsigned_long *)&_kjCondition.result);
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_68);
        if (!bVar1) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<long,unsigned_long&>&,char_const(&)[20]>
                    (&local_80,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0x1eb,FAILED,"end - ptr >= count","_kjCondition,\"invalid packed data\"",
                     (DebugComparison<long,_unsigned_long_&> *)local_68,
                     (char (*) [20])"invalid packed data");
          kj::_::Debug::Fault::fatal(&local_80);
        }
        end = end + _kjCondition._32_8_ + 1;
        if (x != 0) break;
        f_1.exception =
             (Exception *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&end);
        kj::_::DebugExpression<unsigned_char_const*&>::operator<
                  ((DebugComparison<const_unsigned_char_*&,_const_unsigned_char_*&> *)local_b8,
                   (DebugExpression<unsigned_char_const*&> *)&f_1,(uchar **)&total);
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
        if (!bVar1) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char_const*&,unsigned_char_const*&>&,char_const(&)[20]>
                    ((Fault *)&_kjCondition_2.result,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0x1ef,FAILED,"ptr < end","_kjCondition,\"invalid packed data\"",
                     (DebugComparison<const_unsigned_char_*&,_const_unsigned_char_*&> *)local_b8,
                     (char (*) [20])"invalid packed data");
          kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_2.result);
        }
        sStack_30 = *end + sStack_30;
        end = end + 1;
      }
    } while (x != 0xff);
    f_2.exception =
         (Exception *)
         kj::_::DebugExpressionStart::operator<<((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&end);
    kj::_::DebugExpression<unsigned_char_const*&>::operator<
              ((DebugComparison<const_unsigned_char_*&,_const_unsigned_char_*&> *)local_f0,
               (DebugExpression<unsigned_char_const*&> *)&f_2,(uchar **)&total);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f0);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char_const*&,unsigned_char_const*&>&,char_const(&)[20]>
                ((Fault *)&words,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,0x1f2,FAILED,"ptr < end","_kjCondition,\"invalid packed data\"",
                 (DebugComparison<const_unsigned_char_*&,_const_unsigned_char_*&> *)local_f0,
                 (char (*) [20])"invalid packed data");
      kj::_::Debug::Fault::fatal((Fault *)&words);
    }
    sStack_30 = *end + sStack_30;
    _kjCondition_3._32_8_ = (ulong)*end << 3;
    f_3.exception = (Exception *)(total - (long)(end + 1));
    end = end + 1;
    local_140 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(long *)&f_3);
    kj::_::DebugExpression<long>::operator>=
              ((DebugComparison<long,_unsigned_long_&> *)local_138,&local_140,
               (unsigned_long *)&_kjCondition_3.result);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_138);
    if (!bVar1) break;
    end = end + _kjCondition_3._32_8_;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<long,unsigned_long&>&,char_const(&)[20]>
            (&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
             ,0x1f6,FAILED,"end - ptr >= bytes","_kjCondition,\"invalid packed data\"",
             (DebugComparison<long,_unsigned_long_&> *)local_138,
             (char (*) [20])"invalid packed data");
  kj::_::Debug::Fault::fatal(&local_150);
}

Assistant:

size_t computeUnpackedSizeInWords(kj::ArrayPtr<const byte> packedBytes) {
  const byte* ptr = packedBytes.begin();
  const byte* end = packedBytes.end();

  size_t total = 0;
  while (ptr < end) {
    uint tag = *ptr;
    size_t count = kj::popCount(tag);
    total += 1;
    KJ_REQUIRE(end - ptr >= count, "invalid packed data");
    ptr += count + 1;

    if (tag == 0) {
      KJ_REQUIRE(ptr < end, "invalid packed data");
      total += *ptr++;
    } else if (tag == 0xff) {
      KJ_REQUIRE(ptr < end, "invalid packed data");
      size_t words = *ptr++;
      total += words;
      size_t bytes = words * sizeof(word);
      KJ_REQUIRE(end - ptr >= bytes, "invalid packed data");
      ptr += bytes;
    }
  }

  return total;
}